

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O0

char * NCONF_get_string(CONF *conf,char *group,char *name)

{
  CONF_VALUE *pCVar1;
  CONF_VALUE *value;
  CONF_VALUE templ;
  char *name_local;
  char *section_local;
  CONF *conf_local;
  
  name_local = group;
  if (group == (char *)0x0) {
    name_local = "default";
  }
  templ.value = name;
  OPENSSL_memset(&value,0,0x18);
  value = (CONF_VALUE *)name_local;
  templ.section = templ.value;
  pCVar1 = lh_CONF_VALUE_retrieve((lhash_st_CONF_VALUE *)conf->meth,(CONF_VALUE *)&value);
  if (pCVar1 == (CONF_VALUE *)0x0) {
    conf_local = (CONF *)0x0;
  }
  else {
    conf_local = (CONF *)pCVar1->value;
  }
  return (char *)conf_local;
}

Assistant:

const char *NCONF_get_string(const CONF *conf, const char *section,
                             const char *name) {
  CONF_VALUE templ, *value;

  if (section == NULL) {
    section = kDefaultSectionName;
  }

  OPENSSL_memset(&templ, 0, sizeof(templ));
  templ.section = (char *)section;
  templ.name = (char *)name;
  value = lh_CONF_VALUE_retrieve(conf->values, &templ);
  if (value == NULL) {
    return NULL;
  }
  return value->value;
}